

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_node_set * __thiscall
pugi::xpath_query::evaluate_node_set
          (xpath_node_set *__return_storage_ptr__,xpath_query *this,xpath_node *n)

{
  xpath_ast_node *this_00;
  xpath_node_set_raw r;
  xpath_context c;
  xpath_stack_data sd;
  xpath_node_set_raw local_20b8;
  xpath_context local_2098;
  xpath_memory_block local_2078;
  xpath_memory_block local_1068;
  xpath_allocator local_58;
  xpath_allocator local_40;
  xpath_stack local_28;
  bool local_18 [8];
  
  if (((undefined8 *)this->_impl == (undefined8 *)0x0) ||
     (this_00 = *this->_impl, this_00->_rettype != '\x01')) {
    xpath_node_set::xpath_node_set(__return_storage_ptr__);
  }
  else {
    local_2098.n._node._root = (n->_node)._root;
    local_2098.n._attribute._attr = (n->_attribute)._attr;
    local_2098.position = 1;
    local_2098.size = 1;
    local_28.result = &local_58;
    local_58._error = local_18;
    local_58._root = &local_2078;
    local_58._root_size = 0;
    local_28.temp = &local_40;
    local_40._root = &local_1068;
    local_40._root_size = 0;
    local_18[0] = false;
    local_1068.next = (xpath_memory_block *)0x0;
    local_2078.next = (xpath_memory_block *)0x0;
    local_1068.capacity = 0x1000;
    local_2078.capacity = 0x1000;
    local_40._error = local_58._error;
    impl::anon_unknown_0::xpath_ast_node::eval_node_set
              (&local_20b8,this_00,&local_2098,&local_28,nodeset_eval_all);
    if (local_18[0] == true) {
      xpath_node_set::xpath_node_set(__return_storage_ptr__);
    }
    else {
      xpath_node_set::xpath_node_set
                (__return_storage_ptr__,local_20b8._begin,local_20b8._end,local_20b8._type);
    }
    impl::anon_unknown_0::xpath_allocator::release((xpath_allocator *)local_58._root);
    impl::anon_unknown_0::xpath_allocator::release((xpath_allocator *)local_40._root);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xpath_node_set xpath_query::evaluate_node_set(const xpath_node& n) const
	{
		impl::xpath_ast_node* root = impl::evaluate_node_set_prepare(static_cast<impl::xpath_query_impl*>(_impl));
		if (!root) return xpath_node_set();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_node_set_raw r = root->eval_node_set(c, sd.stack, impl::nodeset_eval_all);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return xpath_node_set();
		#else
			throw std::bad_alloc();
		#endif
		}

		return xpath_node_set(r.begin(), r.end(), r.type());
	}